

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  byte bVar1;
  int iVar2;
  int p2;
  Parse *pParse;
  SrcList *pSVar3;
  Vdbe *v;
  WhereRightJoin *pWVar4;
  WhereLoop *pWVar5;
  WhereTerm *pWVar6;
  Table *pTab;
  int iVar7;
  Expr *pEVar8;
  Expr *pWhere;
  WhereInfo *pWInfo_00;
  Index *pIVar9;
  ulong uVar10;
  int p2_00;
  ulong uVar11;
  long lVar12;
  SrcItem *pSVar13;
  SrcItem *pSVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  ulong local_c0;
  SrcList sFrom;
  
  bVar17 = 0;
  pParse = pWInfo->pParse;
  pSVar3 = pWInfo->pTabList;
  v = pParse->pVdbe;
  pWVar4 = pLevel->pRJ;
  pWVar5 = pLevel->pWLoop;
  bVar1 = pLevel->iFrom;
  uVar11 = 0;
  local_c0 = 1;
  sqlite3VdbeExplain(pParse,'\x01',"RIGHT-JOIN %s",(pSVar3->a[bVar1].pTab)->zName);
  uVar16 = (ulong)(uint)iLevel;
  if (iLevel < 1) {
    uVar16 = uVar11;
  }
  uVar10 = 0;
  for (; uVar16 * 0x70 - uVar11 != 0; uVar11 = uVar11 + 0x70) {
    uVar10 = uVar10 | *(ulong *)(*(long *)((long)&pWInfo->a[0].pWLoop + uVar11) + 8);
    sqlite3VdbeAddOp1(v,0x88,*(int *)((long)&pWInfo->a[0].iTabCur + uVar11));
    iVar7 = *(int *)((long)&pWInfo->a[0].iIdxCur + uVar11);
    if (iVar7 != 0) {
      sqlite3VdbeAddOp1(v,0x88,iVar7);
    }
  }
  if ((pSVar3->a[bVar1].fg.jointype & 0x40) == 0) {
    uVar16 = pWVar5->maskSelf;
    lVar12 = 0;
    pWhere = (Expr *)0x0;
    for (lVar15 = 0;
        (lVar12 < (pWInfo->sWC).nTerm &&
        ((pWVar6 = (pWInfo->sWC).a, (*(ushort *)((long)&pWVar6->wtFlags + lVar15) & 0x8002) == 0 ||
         (*(short *)((long)&pWVar6->eOperator + lVar15) == 0x2000)))); lVar15 = lVar15 + 0x38) {
      if (((*(ulong *)((long)&pWVar6->prereqAll + lVar15) & ~(uVar10 | uVar16)) == 0) &&
         (pEVar8 = *(Expr **)((long)&pWVar6->pExpr + lVar15), (pEVar8->flags & 3) == 0)) {
        pEVar8 = sqlite3ExprDup(pParse->db,pEVar8,0);
        pWhere = sqlite3ExprAnd(pParse,pWhere,pEVar8);
      }
      lVar12 = lVar12 + 1;
    }
  }
  else {
    pWhere = (Expr *)0x0;
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  pSVar13 = pSVar3->a + bVar1;
  pSVar14 = sFrom.a;
  for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
    pSVar14->pSchema = pSVar13->pSchema;
    pSVar13 = (SrcItem *)((long)pSVar13 + ((ulong)bVar17 * -2 + 1) * 8);
    pSVar14 = (SrcItem *)((long)pSVar14 + (ulong)bVar17 * -0x10 + 8);
  }
  sFrom.a[0].fg.jointype = '\0';
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + '\x01';
  pWInfo_00 = sqlite3WhereBegin(pParse,&sFrom,pWhere,(ExprList *)0x0,(ExprList *)0x0,(Select *)0x0,
                                0x1000,0);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    iVar7 = pLevel->iTabCur;
    iVar2 = pParse->nMem;
    p2_00 = iVar2 + 1;
    pParse->nMem = p2_00;
    p2 = pWInfo_00->iContinue;
    pTab = pSVar3->a[bVar1].pTab;
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3VdbeAddOp2(v,0x87,iVar7,p2_00);
    }
    else {
      pIVar9 = sqlite3PrimaryKeyIndex(pTab);
      local_c0 = (ulong)pIVar9->nKeyCol;
      pParse->nMem = iVar2 + (uint)pIVar9->nKeyCol;
      for (uVar16 = 0; local_c0 != uVar16; uVar16 = uVar16 + 1) {
        sqlite3ExprCodeGetColumnOfTable
                  (v,pTab,iVar7,(int)pIVar9->aiColumn[uVar16],(int)uVar16 + p2_00);
      }
    }
    iVar7 = sqlite3VdbeAddOp4Int(v,0x3f,pWVar4->regBloom,0,p2_00,(int)local_c0);
    sqlite3VdbeAddOp4Int(v,0x1c,pWVar4->iMatch,p2,p2_00,(int)local_c0);
    sqlite3VdbeJumpHere(v,iVar7);
    sqlite3VdbeAddOp2(v,9,pWVar4->regReturn,pWVar4->addrSubrtn);
    sqlite3WhereEnd(pWInfo_00);
  }
  sqlite3ExprDelete(pParse->db,pWhere);
  sqlite3VdbeExplainPop(pParse);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + 0xff;
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}